

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

Extra_UnateInfo_t * Extra_UnateComputeSlow(DdManager *dd,DdNode *bFunc)

{
  int iVar1;
  DdNode *n;
  Extra_UnateInfo_t *pEVar2;
  int local_3c;
  int Res;
  int i;
  Extra_UnateInfo_t *p;
  DdNode *bTemp;
  DdNode *bSupp;
  int nSuppSize;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  iVar1 = Extra_bddSuppSize(dd,n);
  pEVar2 = Extra_UnateInfoAllocate(iVar1);
  pEVar2->nVarsMax = dd->size;
  local_3c = 0;
  for (p = (Extra_UnateInfo_t *)n; (DdNode *)p != dd->one; p = (Extra_UnateInfo_t *)p->pVars) {
    iVar1 = Extra_bddCheckUnateNaive(dd,bFunc,p->nVars);
    pEVar2->pVars[local_3c] =
         (Extra_UnateVar_t)((uint)pEVar2->pVars[local_3c] & 0xc0000000 | p->nVars & 0x3fffffffU);
    if (iVar1 == -1) {
      pEVar2->pVars[local_3c] =
           (Extra_UnateVar_t)((uint)pEVar2->pVars[local_3c] & 0x7fffffff | 0x80000000);
    }
    else if (iVar1 == 1) {
      pEVar2->pVars[local_3c] =
           (Extra_UnateVar_t)((uint)pEVar2->pVars[local_3c] & 0xbfffffff | 0x40000000);
    }
    pEVar2->nUnate = (uint)(iVar1 != 0) + pEVar2->nUnate;
    local_3c = local_3c + 1;
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar2;
}

Assistant:

Extra_UnateInfo_t * Extra_UnateComputeSlow( DdManager * dd, DdNode * bFunc )
{
    int nSuppSize;
    DdNode * bSupp, * bTemp;
    Extra_UnateInfo_t * p;
    int i, Res;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        Res = Extra_bddCheckUnateNaive( dd, bFunc, bTemp->index );
        p->pVars[i].iVar = bTemp->index;
        if ( Res == -1 )
            p->pVars[i].Neg = 1;
        else if ( Res == 1 )
            p->pVars[i].Pos = 1;
        p->nUnate += (Res != 0);
    }
    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}